

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_free(REF_CAVITY ref_cavity)

{
  if (ref_cavity != (REF_CAVITY)0x0) {
    ref_list_free(ref_cavity->tet_list);
    ref_list_free(ref_cavity->tri_list);
    if (ref_cavity->f2n != (REF_INT *)0x0) {
      free(ref_cavity->f2n);
    }
    if (ref_cavity->s2n != (REF_INT *)0x0) {
      free(ref_cavity->s2n);
    }
    free(ref_cavity);
    return 0;
  }
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_free(REF_CAVITY ref_cavity) {
  if (NULL == (void *)ref_cavity) return REF_NULL;
  ref_list_free(ref_cavity->tet_list);
  ref_list_free(ref_cavity->tri_list);
  ref_free(ref_cavity->f2n);
  ref_free(ref_cavity->s2n);
  ref_free(ref_cavity);
  return REF_SUCCESS;
}